

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_surrender(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *mob;
  CHAR_DATA *arg2;
  
  arg2 = in_RDI->fighting;
  if (arg2 == (CHAR_DATA *)0x0) {
    send_to_char((char *)mob,in_RDI);
  }
  else {
    act((char *)mob,in_RDI,in_RSI,arg2,0);
    act((char *)mob,in_RDI,in_RSI,arg2,0);
    act((char *)mob,in_RDI,in_RSI,arg2,0);
    stop_fighting(in_RSI,SUB81((ulong)arg2 >> 0x38,0));
  }
  return;
}

Assistant:

void do_surrender(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *mob = ch->fighting;

	if (mob == nullptr)
	{
		send_to_char("But you're not fighting!\n\r", ch);
		return;
	}

	act("You surrender to $N!", ch, nullptr, mob, TO_CHAR);
	act("$n surrenders to you!", ch, nullptr, mob, TO_VICT);
	act("$n tries to surrender to $N!", ch, nullptr, mob, TO_NOTVICT);
	stop_fighting(ch, true);
}